

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minefield.cpp
# Opt level: O1

bool __thiscall Minefield::isMine(Minefield *this,int x,int y)

{
  runtime_error *this_00;
  ulong uVar1;
  ulong uVar2;
  
  checkPos(this,x,y);
  uVar2 = (ulong)y;
  if ((this->opened_mine == false) &&
     (this->given_mine_count < this->given_y_dimension * this->given_x_dimension - this->open_cnt))
  {
    checkPos(this,x,y);
    uVar1 = uVar2 + 0x3f;
    if (-1 < (long)uVar2) {
      uVar1 = uVar2;
    }
    if ((*(ulong *)(((long)uVar1 >> 6) * 8 +
                    *(long *)&(this->opened).
                              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[x].
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data + -8 +
                   (ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) * 8) >> (uVar2 & 0x3f)
        & 1) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Can\'t check if is mine on not-opened field.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  uVar1 = uVar2 + 0x3f;
  if (-1 < (long)uVar2) {
    uVar1 = uVar2;
  }
  return (*(ulong *)(((long)uVar1 >> 6) * 8 +
                     *(long *)&(this->mines).
                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[x].
                               super__Bvector_base<std::allocator<bool>_>._M_impl + -8 +
                    (ulong)((uVar2 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
          (uVar2 & 0x3f) & 1) != 0;
}

Assistant:

bool Minefield::isMine(int x, int y) {
    checkPos(x, y);
    if (isGameRunning() && ! isOpen(x, y)) {
        throw std::runtime_error("Can't check if is mine on not-opened field.");
    }

    return mines[x][y];
}